

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_empty1(bcf1_t *v)

{
  bcf1_t *v_local;
  
  bcf_clear(v);
  free((v->d).id);
  free((v->d).als);
  free((v->d).allele);
  free((v->d).flt);
  free((v->d).info);
  free((v->d).fmt);
  if ((v->d).var != (variant_t *)0x0) {
    free((v->d).var);
  }
  free((v->shared).s);
  free((v->indiv).s);
  return;
}

Assistant:

void bcf_empty1(bcf1_t *v)
{
    bcf_clear1(v);
    free(v->d.id);
    free(v->d.als);
    free(v->d.allele); free(v->d.flt); free(v->d.info); free(v->d.fmt);
    if (v->d.var ) free(v->d.var);
    free(v->shared.s); free(v->indiv.s);
}